

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* pbrt::MatchingFilenames
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *filenameBase)

{
  undefined8 uVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  string dirStr;
  path basePath;
  undefined1 local_118 [40];
  pointer local_f0;
  string local_e8;
  string local_c8;
  path local_a8;
  path local_80;
  path local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filesystem::path::path(&local_80,filenameBase);
  filesystem::path::parent_path((path *)local_118,&local_80);
  filesystem::path::str_abi_cxx11_(&local_e8,(path *)local_118,native_path);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_118 + 8));
  if (local_e8._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_e8,0,(char *)0x0,0x4a70d0);
  }
  __dirp = opendir(local_e8._M_dataplus._M_p);
  if (__dirp != (DIR *)0x0) {
    filesystem::path::filename_abi_cxx11_((string *)local_118,&local_80);
    local_f0 = (pointer)local_118._8_8_;
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
    }
    while( true ) {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) break;
      if (pdVar3->d_type == '\b') {
        filesystem::path::filename_abi_cxx11_((string *)local_118,&local_80);
        uVar1 = local_118._0_8_;
        iVar2 = strncmp((char *)local_118._0_8_,pdVar3->d_name,(size_t)local_f0);
        if ((undefined1 *)uVar1 != local_118 + 0x10) {
          operator_delete((void *)uVar1,(ulong)(local_118._16_8_ + 1));
        }
        if (iVar2 == 0) {
          filesystem::path::parent_path(&local_a8,&local_80);
          filesystem::path::path(&local_58,pdVar3->d_name);
          filesystem::path::operator/((path *)local_118,&local_a8,&local_58);
          filesystem::path::str_abi_cxx11_(&local_c8,(path *)local_118,native_path);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_118 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_58.m_path);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8.m_path);
        }
      }
    }
    closedir(__dirp);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_80.m_path);
    return __return_storage_ptr__;
  }
  filesystem::path::parent_path((path *)local_118,&local_80);
  filesystem::path::str_abi_cxx11_((string *)&local_a8,(path *)local_118,native_path);
  local_58.m_type = local_a8.m_type;
  local_58._4_4_ = local_a8._4_4_;
  ErrorExit<char_const*>("%s: unable to open directory\n",(char **)&local_58);
}

Assistant:

std::string ReadFileContents(const std::string &filename) {
    std::ifstream ifs(filename, std::ios::binary);
    if (!ifs)
        ErrorExit("%s: %s", filename, ErrorString());
    return std::string((std::istreambuf_iterator<char>(ifs)),
                       (std::istreambuf_iterator<char>()));
}